

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_tuple<binlog::ToStringVisitor,binlog::Range>
               (string_view full_tag,string_view tag,ToStringVisitor *visitor,Range *istream,
               int max_recursion)

{
  string_view tag_00;
  bool bVar1;
  size_t in_RCX;
  char *in_RDX;
  ToStringVisitor *in_R8;
  string_view elem_tag;
  Range *in_stack_00000058;
  ToStringVisitor *in_stack_00000060;
  bool skip;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ToStringVisitor *in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff78;
  string_view *tags;
  string_view local_58;
  char *local_48;
  size_t local_40;
  undefined1 local_31;
  ToStringVisitor *local_28;
  string_view local_20 [2];
  
  local_28 = in_R8;
  local_20[0]._ptr = in_RDX;
  local_20[0]._len = in_RCX;
  string_view::remove_prefix(local_20,1);
  string_view::remove_suffix(local_20,1);
  local_48 = local_20[0]._ptr;
  local_40 = local_20[0]._len;
  local_31 = binlog::ToStringVisitor::visit
                       (in_stack_ffffffffffffff70,(TupleBegin)in_stack_ffffffffffffff78,
                        (Range *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (!(bool)local_31) {
    local_58 = tag_pop((string_view *)in_stack_ffffffffffffff78._len);
    while( true ) {
      tags = (string_view *)in_stack_ffffffffffffff78._len;
      bVar1 = string_view::empty(&local_58);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      tag_00._len = (size_t)visitor;
      tag_00._ptr = (char *)istream;
      visit_impl<binlog::ToStringVisitor,binlog::Range>
                (tag,tag_00,in_stack_00000060,in_stack_00000058,(int)full_tag._len);
      in_stack_ffffffffffffff78 = tag_pop(tags);
      local_58 = in_stack_ffffffffffffff78;
    }
    binlog::ToStringVisitor::visit(local_28);
  }
  return;
}

Assistant:

void visit_tuple(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_prefix(1); // drop (
  tag.remove_suffix(1); // drop )

  const bool skip = visitor.visit(mserialize::Visitor::TupleBegin{tag}, istream);
  if (skip) { return; }

  for (string_view elem_tag = tag_pop(tag); ! elem_tag.empty(); elem_tag = tag_pop(tag))
  {
    visit_impl(full_tag, elem_tag, visitor, istream, max_recursion);
  }

  visitor.visit(mserialize::Visitor::TupleEnd{});
}